

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O0

void atkdp(int bomberNum)

{
  int local_1c;
  int local_18;
  int l;
  int k;
  int j;
  int i;
  int bomberNum_local;
  
  for (k = 0; k < 5; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
          clearBelonging(dpRes[k][l][local_18] + local_1c);
        }
      }
    }
  }
  memset(dpRes,0,35000);
  memset(shipAtk,0,0x10);
  memset(shipAccu,0,0x10);
  memset(usedGrid,0,0x10);
  anothersearch(bomberNum,0,checkNew);
  anothersearch(bomberNum,0,pushNew);
  return;
}

Assistant:

void atkdp(int bomberNum){
    //init
    for(int i=0;i<5;i++)
        for(int j=0;j<5;j++)
            for(int k=0;k<5;k++)
                for(int l=0;l<5;l++)
                    clearBelonging(&dpRes[i][j][k][l]);
    memset(dpRes,0,sizeof(dpRes));
    memset(shipAtk,0,sizeof(shipAtk));
    memset(shipAccu,0,sizeof(shipAccu));
    memset(usedGrid,0,sizeof(usedGrid));

    //search
    anothersearch(bomberNum,0,checkNew);
    anothersearch(bomberNum,0,pushNew);
}